

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void op_flat_append(c2m_ctx_t c2m_ctx,node_t_conflict n,node_t_conflict op)

{
  node_t pnVar1;
  node_t pnVar2;
  tpname_t el;
  tpname_t el_00;
  int iVar3;
  DLIST_LINK_node_t *in_RCX;
  node_t op_00;
  undefined8 extraout_RDX;
  anon_union_16_10_0af5b411_for_u *paVar4;
  anon_union_16_10_0af5b411_for_u *paVar5;
  c2m_ctx_t res;
  undefined4 in_R8D;
  undefined4 uStack_3c;
  
  if (op->code == N_LIST) {
    op_00 = (op->u).ops.head;
    if (op_00 == (node_t)0x0) {
      return;
    }
    paVar5 = &op->u;
    res = c2m_ctx;
    while( true ) {
      pnVar1 = (op_00->op_link).prev;
      pnVar2 = (op_00->op_link).next;
      if (pnVar1 == (node_t)0x0) {
        paVar4 = paVar5;
        if ((node_t_conflict)(paVar5->s).s != op_00) {
          op_flat_append_cold_1();
          goto LAB_001954a7;
        }
      }
      else {
        paVar4 = (anon_union_16_10_0af5b411_for_u *)&(pnVar1->op_link).next;
      }
      in_RCX = &op_00->op_link;
      (paVar4->ops).head = pnVar2;
      if (pnVar2 == (node_t)0x0) break;
      (pnVar2->op_link).prev = pnVar1;
      in_RCX->prev = (node_t)0x0;
      (op_00->op_link).next = (node_t)0x0;
      res = c2m_ctx;
      op_append(c2m_ctx,n,op_00);
      op_00 = pnVar2;
    }
    paVar5 = paVar4;
    if ((node_t_conflict)(op->u).s.len != op_00) {
LAB_001954a7:
      op_flat_append_cold_2();
      el._20_4_ = uStack_3c;
      el.typedef_p = in_R8D;
      el.scope = (node_t_conflict)in_RCX;
      el.id = (node_t_conflict)extraout_RDX;
      iVar3 = HTAB_tpname_t_do(*(HTAB_tpname_t **)&paVar5[2].ops,el,HTAB_FIND,(tpname_t *)res);
      if (iVar3 == 0) {
        el_00._20_4_ = uStack_3c;
        el_00.typedef_p = in_R8D;
        el_00.scope = (node_t_conflict)in_RCX;
        el_00.id = (node_t_conflict)extraout_RDX;
        HTAB_tpname_t_do(*(HTAB_tpname_t **)&paVar5[2].ops,el_00,HTAB_INSERT,(tpname_t *)res);
      }
      return;
    }
    (op->u).ops.tail = pnVar1;
    in_RCX->prev = (node_t)0x0;
    (op_00->op_link).next = (node_t)0x0;
    op = op_00;
  }
  op_append(c2m_ctx,n,op);
  return;
}

Assistant:

static void op_flat_append (c2m_ctx_t c2m_ctx, node_t n, node_t op) {
  if (op->code != N_LIST) {
    op_append (c2m_ctx, n, op);
    return;
  }
  for (node_t next_el, el = NL_HEAD (op->u.ops); el != NULL; el = next_el) {
    next_el = NL_NEXT (el);
    NL_REMOVE (op->u.ops, el);
    op_append (c2m_ctx, n, el);
  }
}